

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O3

void __thiscall CPortDataTransfer::Execute(CPortDataTransfer *this)

{
  ushort uVar1;
  pointer pcVar2;
  int __fd;
  int iVar3;
  int opt;
  sockaddr_in clientaddr;
  string ret;
  sockaddr_in bindaddr;
  undefined4 local_64;
  sockaddr local_60;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  sockaddr local_30;
  
  __fd = socket(2,1,0);
  local_60.sa_data._2_4_ = inet_addr((this->m_RemoteIp)._M_dataplus._M_p);
  uVar1 = (ushort)this->m_RemotePort;
  local_60.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  local_60.sa_family = 2;
  local_30.sa_family = 2;
  local_30.sa_data[0] = '\x13';
  local_30.sa_data[1] = -0x77;
  local_30.sa_data[2] = '\0';
  local_30.sa_data[3] = '\0';
  local_30.sa_data[4] = '\0';
  local_30.sa_data[5] = '\0';
  local_64 = 1;
  setsockopt(__fd,1,2,&local_64,4);
  iVar3 = bind(__fd,&local_30,0x10);
  if (iVar3 == -1) {
    perror("bind error ");
  }
  iVar3 = connect(__fd,&local_60,0x10);
  if (iVar3 == 0) {
    DispatchCommand(this,__fd);
  }
  else {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"425 Failed to establish connection.\r\n","");
    write(this->m_ControlSock,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  close(__fd);
  (this->super_CThread)._vptr_CThread = (_func_int **)&PTR_Execute_0012bd78;
  pcVar2 = (this->m_RemoteIp)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_RemoteIp).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_Msg)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_Msg).field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

void CPortDataTransfer::Execute() {
    int clientsock = socket(AF_INET,SOCK_STREAM,0);
    struct sockaddr_in clientaddr,bindaddr;
    clientaddr.sin_addr.s_addr = inet_addr(m_RemoteIp.c_str());
    clientaddr.sin_port = htons(m_RemotePort);
    clientaddr.sin_family = AF_INET;

    bindaddr.sin_port = htons(5001);
    bindaddr.sin_family = AF_INET;
    bindaddr.sin_addr.s_addr = INADDR_ANY;

    int opt = 1;
    setsockopt(clientsock, SOL_SOCKET, SO_REUSEADDR, (const void *)&opt, sizeof(opt));

    if(bind(clientsock,(struct sockaddr*)&bindaddr,sizeof(bindaddr)) == -1){
        perror("bind error ");
    }


    if(0 == connect(clientsock,(struct sockaddr*)&clientaddr,sizeof(clientaddr))){
        int ret = DispatchCommand(clientsock);
    }
    else{
        string ret = "425 Failed to establish connection.\r\n";
        ControlSockSendMsg(ret);
    }

    close(clientsock);
    delete this;
}